

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O3

ModelPtr createModelTwoComponentsWithOneVariableEach
                   (string *modelName,string *c1Name,string *c2Name,string *v1Name,string *v2Name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ModelPtr MVar2;
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr c2;
  ComponentPtr c1;
  long *local_90 [2];
  long local_80 [2];
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  ModelPtr local_50;
  ModelPtr local_40;
  
  libcellml::Model::create();
  libcellml::NamedEntity::setName((string *)(modelName->_M_dataplus)._M_p);
  createComponentInModel(&local_40,modelName);
  createComponentInModel(&local_50,modelName);
  libcellml::Variable::create();
  libcellml::NamedEntity::setName(local_60);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"public","");
  libcellml::Variable::setInterfaceType(local_60);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  libcellml::Component::addVariable
            ((shared_ptr *)
             local_40.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::create();
  libcellml::NamedEntity::setName(local_70);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"public","");
  libcellml::Variable::setInterfaceType(local_70);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  libcellml::Component::addVariable
            ((shared_ptr *)
             local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  _Var1._M_pi = extraout_RDX;
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    _Var1._M_pi = extraout_RDX_01;
  }
  if (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_02;
  }
  if (local_40.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
    _Var1._M_pi = extraout_RDX_03;
  }
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)modelName;
  return (ModelPtr)MVar2.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

libcellml::ModelPtr createModelTwoComponentsWithOneVariableEach(const std::string &modelName, const std::string &c1Name, const std::string &c2Name, const std::string &v1Name, const std::string &v2Name)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName(modelName);
    auto c1 = createComponentInModel(model, c1Name);
    auto c2 = createComponentInModel(model, c2Name);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName(v1Name);
    v1->setInterfaceType("public");
    c1->addVariable(v1);
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName(v2Name);
    v2->setInterfaceType("public");
    c2->addVariable(v2);

    return model;
}